

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O2

void __thiscall
libDAI::HAK::findLoopClusters
          (HAK *this,FactorGraph *fg,
          set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_> *allcl,
          VarSet *newcl,Var *root,size_t length,VarSet *vars)

{
  bool bVar1;
  Var *n;
  VarSet ind;
  VarSet local_d0;
  VarSet local_b0;
  VarSet local_90;
  VarSet local_70;
  VarSet local_50;
  
  n = (vars->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start;
  do {
    if (n == (vars->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_finish) {
      return;
    }
    (*(fg->super_GraphicalModel)._vptr_GraphicalModel[0xe])(&local_50,fg,n);
    if ((ulong)((long)(newcl->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(newcl->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 0x11) {
LAB_004e164e:
      if (1 < length) {
        VarSet::VarSet(&local_d0,n);
        VarSet::operator|(&local_b0,newcl,&local_d0);
        VarSet::operator/(&local_70,&local_50,newcl);
        findLoopClusters(this,fg,allcl,&local_b0,root,length - 1,&local_70);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_70);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_b0);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_d0);
      }
    }
    else {
      VarSet::VarSet(&local_d0,root);
      bVar1 = VarSet::includes(&local_50,&local_d0);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_d0);
      if (!bVar1) goto LAB_004e164e;
      VarSet::VarSet(&local_90,n);
      VarSet::operator|(&local_d0,newcl,&local_90);
      std::
      _Rb_tree<libDAI::VarSet,_libDAI::VarSet,_std::_Identity<libDAI::VarSet>,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
      ::_M_insert_unique<libDAI::VarSet>(&allcl->_M_t,&local_d0);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_d0);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_90);
    }
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_50);
    n = n + 1;
  } while( true );
}

Assistant:

void HAK::findLoopClusters( const FactorGraph & fg, std::set<VarSet> &allcl, VarSet newcl, const Var & root, size_t length, VarSet vars ) {
        for( VarSet::const_iterator in = vars.begin(); in != vars.end(); in++ ) {
            VarSet ind = fg.delta( *in );
            if( (newcl.size()) >= 2 && (ind >> root) ) {
                allcl.insert( newcl | *in );
            }
            else if( length > 1 )
                findLoopClusters( fg, allcl, newcl | *in, root, length - 1, ind / newcl );
        }
    }